

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O0

int __thiscall KMPNativeAffinity::Mask::begin(Mask *this)

{
  int iVar1;
  long *in_RDI;
  int retval;
  undefined1 local_19;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = (**(code **)(*in_RDI + 0x58))();
    local_19 = 0;
    if (local_c < iVar1) {
      local_19 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_c);
      local_19 = local_19 ^ 0xff;
    }
    if ((local_19 & 1) == 0) break;
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int begin() const override {
      int retval = 0;
      while (retval < end() && !is_set(retval))
        ++retval;
      return retval;
    }